

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O1

void __thiscall
duckdb_re2::DFA::RunWorkqOnEmptyString(DFA *this,Workq *oldq,Workq *newq,uint32_t flag)

{
  int id;
  int *piVar1;
  
  (newq->super_SparseSet).size_ = 0;
  newq->nextmark_ = newq->n_;
  if ((oldq->super_SparseSet).size_ != 0) {
    piVar1 = ((_Head_base<0UL,_int_*,_false> *)
             ((long)&(oldq->super_SparseSet).dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8))->
             _M_head_impl;
    do {
      id = *piVar1;
      if (oldq->n_ <= id) {
        id = -1;
      }
      AddToQueue(this,newq,id,flag);
      piVar1 = piVar1 + 1;
    } while (piVar1 != ((_Head_base<0UL,_int_*,_false> *)
                       ((long)&(oldq->super_SparseSet).dense_.ptr_._M_t.
                               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter> + 8
                       ))->_M_head_impl + (oldq->super_SparseSet).size_);
  }
  return;
}

Assistant:

void clear() {
    size_ = 0;
  }